

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall ncnn::ParamDict::set(ParamDict *this,int id,Mat *v)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Mat *pMVar7;
  
  pMVar7 = &this->params[id].v;
  this->params[id].loaded = 1;
  if (pMVar7 != v) {
    piVar1 = v->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = this->params[id].v.refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = this->params[id].v.data;
        pAVar3 = this->params[id].v.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(*(void **)((long)pvVar2 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 8))();
        }
      }
    }
    pMVar7->data = (void *)0x0;
    this->params[id].v.refcount = (int *)0x0;
    this->params[id].v.elemsize = 0;
    this->params[id].v.cstep = 0;
    this->params[id].v.dims = 0;
    this->params[id].v.w = 0;
    this->params[id].v.h = 0;
    this->params[id].v.c = 0;
    piVar1 = v->refcount;
    this->params[id].v.data = v->data;
    this->params[id].v.refcount = piVar1;
    this->params[id].v.elemsize = v->elemsize;
    this->params[id].v.allocator = v->allocator;
    iVar4 = v->w;
    iVar5 = v->h;
    iVar6 = v->c;
    this->params[id].v.dims = v->dims;
    this->params[id].v.w = iVar4;
    this->params[id].v.h = iVar5;
    this->params[id].v.c = iVar6;
    this->params[id].v.cstep = v->cstep;
  }
  return;
}

Assistant:

void ParamDict::set(int id, const Mat& v)
{
    params[id].loaded = 1;
    params[id].v = v;
}